

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O3

string * __thiscall
pbrt::PowerLightSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,PowerLightSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::AliasTable_const&>
            (__return_storage_ptr__,"[ PowerLightSampler aliasTable: %s ]",&this->aliasTable);
  return __return_storage_ptr__;
}

Assistant:

std::string PowerLightSampler::ToString() const {
    return StringPrintf("[ PowerLightSampler aliasTable: %s ]", aliasTable);
}